

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

QSize __thiscall QTableView::viewportSizeHint(QTableView *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  QSize QVar5;
  int iVar6;
  int iVar7;
  
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  lVar2 = *(long *)(*(long *)(lVar1 + 0x588) + 0x20);
  iVar6 = 0;
  iVar7 = 0;
  if ((*(byte *)(lVar2 + 10) & 1) == 0) {
    iVar7 = (*(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14)) + 1;
  }
  iVar3 = QHeaderView::length(*(QHeaderView **)(lVar1 + 0x580));
  lVar2 = *(long *)(*(long *)(lVar1 + 0x580) + 0x20);
  if ((*(byte *)(lVar2 + 10) & 1) == 0) {
    iVar6 = (*(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18)) + 1;
  }
  iVar4 = QHeaderView::length(*(QHeaderView **)(lVar1 + 0x588));
  QVar5.ht.m_i = iVar4 + iVar6;
  QVar5.wd.m_i = iVar3 + iVar7;
  return QVar5;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }